

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationUtil.cpp
# Opt level: O2

Move<vk::Handle<(vk::HandleType)16>_> *
vkt::tessellation::makePipelineLayout
          (Move<vk::Handle<(vk::HandleType)16>_> *__return_storage_ptr__,DeviceInterface *vk,
          VkDevice device,VkDescriptorSetLayout descriptorSetLayout)

{
  VkPipelineLayoutCreateInfo info;
  VkDescriptorSetLayout local_40;
  VkPipelineLayoutCreateInfo local_38;
  
  local_38.sType = VK_STRUCTURE_TYPE_PIPELINE_LAYOUT_CREATE_INFO;
  local_38.pNext = (void *)0x0;
  local_38.flags = 0;
  local_38.setLayoutCount = 1;
  local_38.pSetLayouts = &local_40;
  local_38.pushConstantRangeCount = 0;
  local_38.pPushConstantRanges = (VkPushConstantRange *)0x0;
  local_40.m_internal = descriptorSetLayout.m_internal;
  ::vk::createPipelineLayout
            (__return_storage_ptr__,vk,device,&local_38,(VkAllocationCallbacks *)0x0);
  return __return_storage_ptr__;
}

Assistant:

Move<VkPipelineLayout> makePipelineLayout (const DeviceInterface&		vk,
										   const VkDevice				device,
										   const VkDescriptorSetLayout	descriptorSetLayout)
{
	const VkPipelineLayoutCreateInfo info =
	{
		VK_STRUCTURE_TYPE_PIPELINE_LAYOUT_CREATE_INFO,		// VkStructureType				sType;
		DE_NULL,											// const void*					pNext;
		(VkPipelineLayoutCreateFlags)0,						// VkPipelineLayoutCreateFlags	flags;
		1u,													// deUint32						setLayoutCount;
		&descriptorSetLayout,								// const VkDescriptorSetLayout*	pSetLayouts;
		0u,													// deUint32						pushConstantRangeCount;
		DE_NULL,											// const VkPushConstantRange*	pPushConstantRanges;
	};
	return createPipelineLayout(vk, device, &info);
}